

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse-matrix.hpp
# Opt level: O2

void __thiscall
baryonyx::sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>
          (sparse_matrix<int> *this,
          vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
          *csts,int rows,int cols)

{
  _Vector_impl_data *p_Var1;
  uint *puVar2;
  pointer pmVar3;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false> _Var4;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false> _Var5;
  function_element *pfVar6;
  pointer pfVar7;
  _Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_> _Var8;
  _Head_base<0UL,_int_*,_false> _Var9;
  long lVar10;
  size_type sVar11;
  int i;
  ulong uVar12;
  pointer *ppfVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  int e;
  function_element *fct_elem;
  function_element *__args_2;
  int iVar17;
  ulong uVar18;
  col_value cVar19;
  size_type n;
  vector<access,_std::allocator<access>_> accessors;
  fixed_array<int> rinit;
  fixed_array<int> cinit;
  value_type_conflict1 local_34;
  
  fixed_array<int>::fixed_array(&this->m_rows_access,rows + 1);
  fixed_array<int>::fixed_array(&this->m_cols_access,cols + 1);
  (this->m_rows_values).m_buffer._M_t.
  super___uniq_ptr_impl<baryonyx::sparse_matrix<int>::row_value,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
  .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl =
       (row_value *)0x0;
  (this->m_rows_values).m_length = 0;
  (this->m_cols_values).m_buffer._M_t.
  super___uniq_ptr_impl<baryonyx::sparse_matrix<int>::col_value,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
  .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>._M_head_impl =
       (col_value *)0x0;
  (this->m_cols_values).m_length = 0;
  uVar18 = (ulong)(uint)rows;
  pmVar3 = (csts->
           super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
           )._M_impl.super__Vector_impl_data._M_start;
  n = 0;
  for (lVar16 = 0; uVar18 * 0x28 - lVar16 != 0; lVar16 = lVar16 + 0x28) {
    n = n + (int)((ulong)(*(long *)((long)&(pmVar3->elements).
                                           super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                           ._M_impl + lVar16 + 8) -
                         *(long *)((long)&(pmVar3->elements).
                                          super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                          ._M_impl + lVar16)) >> 3);
  }
  fixed_array<baryonyx::sparse_matrix<int>::row_value>::fixed_array
            ((fixed_array<baryonyx::sparse_matrix<int>::row_value> *)&accessors,n);
  _Var4._M_head_impl =
       (this->m_rows_values).m_buffer._M_t.
       super___uniq_ptr_impl<baryonyx::sparse_matrix<int>::row_value,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
       ._M_t.
       super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
       .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl;
  (this->m_rows_values).m_buffer._M_t.
  super___uniq_ptr_impl<baryonyx::sparse_matrix<int>::row_value,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
  .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl =
       (row_value *)
       accessors.super__Vector_base<access,_std::allocator<access>_>._M_impl.super__Vector_impl_data
       ._M_start;
  sVar11 = (size_type)
           accessors.super__Vector_base<access,_std::allocator<access>_>._M_impl.
           super__Vector_impl_data._M_finish;
  accessors.super__Vector_base<access,_std::allocator<access>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)CONCAT44(accessors.super__Vector_base<access,_std::allocator<access>_>.
                                _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                (this->m_rows_values).m_length);
  (this->m_rows_values).m_length = sVar11;
  accessors.super__Vector_base<access,_std::allocator<access>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)_Var4._M_head_impl;
  std::
  unique_ptr<baryonyx::sparse_matrix<int>::row_value[],_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
  ::~unique_ptr((unique_ptr<baryonyx::sparse_matrix<int>::row_value[],_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                 *)&accessors);
  fixed_array<baryonyx::sparse_matrix<int>::col_value>::fixed_array
            ((fixed_array<baryonyx::sparse_matrix<int>::col_value> *)&accessors,n);
  _Var5._M_head_impl =
       (this->m_cols_values).m_buffer._M_t.
       super___uniq_ptr_impl<baryonyx::sparse_matrix<int>::col_value,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
       ._M_t.
       super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
       .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>._M_head_impl;
  (this->m_cols_values).m_buffer._M_t.
  super___uniq_ptr_impl<baryonyx::sparse_matrix<int>::col_value,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
  .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>._M_head_impl =
       (col_value *)
       accessors.super__Vector_base<access,_std::allocator<access>_>._M_impl.super__Vector_impl_data
       ._M_start;
  sVar11 = (size_type)
           accessors.super__Vector_base<access,_std::allocator<access>_>._M_impl.
           super__Vector_impl_data._M_finish;
  accessors.super__Vector_base<access,_std::allocator<access>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)CONCAT44(accessors.super__Vector_base<access,_std::allocator<access>_>.
                                _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                (this->m_cols_values).m_length);
  (this->m_cols_values).m_length = sVar11;
  accessors.super__Vector_base<access,_std::allocator<access>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)_Var5._M_head_impl;
  std::
  unique_ptr<baryonyx::sparse_matrix<int>::col_value[],_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
  ::~unique_ptr((unique_ptr<baryonyx::sparse_matrix<int>::col_value[],_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
                 *)&accessors);
  accessors.super__Vector_base<access,_std::allocator<access>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  accessors.super__Vector_base<access,_std::allocator<access>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  accessors.super__Vector_base<access,_std::allocator<access>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  std::vector<access,_std::allocator<access>_>::reserve(&accessors,(long)(int)n);
  for (rinit.m_buffer._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
       super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
       super__Head_base<0UL,_int_*,_false>._M_head_impl._0_4_ = 0;
      (int)rinit.m_buffer._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
           super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
           super__Head_base<0UL,_int_*,_false>._M_head_impl != rows;
      rinit.m_buffer._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
      super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>
      ._M_head_impl._0_4_ =
           (int)rinit.m_buffer._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                super__Head_base<0UL,_int_*,_false>._M_head_impl + 1) {
    pmVar3 = (csts->
             super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pfVar6 = *(pointer *)
              ((long)&pmVar3[(int)rinit.m_buffer._M_t.
                                  super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                                  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                                  super__Head_base<0UL,_int_*,_false>._M_head_impl].elements.
                      super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                      ._M_impl + 8);
    for (__args_2 = *(function_element **)
                     &pmVar3[(int)rinit.m_buffer._M_t.
                                  super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                                  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                                  super__Head_base<0UL,_int_*,_false>._M_head_impl].elements.
                      super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                      ._M_impl; __args_2 != pfVar6; __args_2 = __args_2 + 1) {
      std::
      vector<baryonyx::sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>(std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,int,int)::access,std::allocator<baryonyx::sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>(std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,int,int)::access>>
      ::emplace_back<int&,int_const&,baryonyx::function_element_const&>
                ((vector<baryonyx::sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>(std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,int,int)::access,std::allocator<baryonyx::sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>(std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,int,int)::access>>
                  *)&accessors,(int *)&rinit,&__args_2->variable_index,__args_2);
    }
  }
  cinit.m_buffer._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl._0_4_ = 0;
  fixed_array<int>::fixed_array(&rinit,rows,(value_type_conflict1 *)&cinit);
  uVar14 = (accessors.super__Vector_base<access,_std::allocator<access>_>._M_impl.
            super__Vector_impl_data._M_start)->row;
  lVar16 = 8;
  iVar17 = 0;
  for (uVar12 = 0; n != uVar12; uVar12 = uVar12 + 1) {
    if (uVar14 != *(uint *)((long)accessors.super__Vector_base<access,_std::allocator<access>_>.
                                  _M_impl.super__Vector_impl_data._M_start + lVar16 + -8)) {
      *(int *)(CONCAT44(rinit.m_buffer._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>.
                        _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                        super__Head_base<0UL,_int_*,_false>._M_head_impl._4_4_,
                        (int)rinit.m_buffer._M_t.
                             super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                             super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                             super__Head_base<0UL,_int_*,_false>._M_head_impl) + (ulong)uVar14 * 4)
           = iVar17;
      iVar17 = 0;
      uVar14 = *(uint *)((long)accessors.super__Vector_base<access,_std::allocator<access>_>._M_impl
                               .super__Vector_impl_data._M_start + lVar16 + -8);
    }
    *(int *)((long)&(accessors.super__Vector_base<access,_std::allocator<access>_>._M_impl.
                     super__Vector_impl_data._M_start)->row + lVar16) = (int)uVar12;
    iVar17 = iVar17 + 1;
    lVar10 = lVar16 + -4;
    lVar16 = lVar16 + 0x14;
    (this->m_rows_values).m_buffer._M_t.
    super___uniq_ptr_impl<baryonyx::sparse_matrix<int>::row_value,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
    ._M_t.
    super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
    .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl[uVar12] =
         (row_value)
         (((ulong)*(uint *)((long)accessors.super__Vector_base<access,_std::allocator<access>_>.
                                  _M_impl.super__Vector_impl_data._M_start + lVar10) << 0x20) +
         uVar12);
  }
  *(int *)(CONCAT44(rinit.m_buffer._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t
                    .super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                    super__Head_base<0UL,_int_*,_false>._M_head_impl._4_4_,
                    (int)rinit.m_buffer._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>
                         ._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                         super__Head_base<0UL,_int_*,_false>._M_head_impl) + (ulong)uVar14 * 4) =
       iVar17;
  ppfVar13 = (pointer *)
             ((long)&(((csts->
                       super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                       )._M_impl.super__Vector_impl_data._M_start)->elements).
                     super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                     ._M_impl + 8);
  uVar12 = 0;
  do {
    if (uVar18 == uVar12) {
      std::
      __stable_sort<__gnu_cxx::__normal_iterator<baryonyx::sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>(std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,int,int)::access*,std::vector<baryonyx::sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>(std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,int,int)::access,std::allocator<baryonyx::sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>(std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,int,int)::access>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>(std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,int,int)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                (accessors.super__Vector_base<access,_std::allocator<access>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 accessors.super__Vector_base<access,_std::allocator<access>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      local_34 = 0;
      fixed_array<int>::fixed_array(&cinit,cols,&local_34);
      uVar14 = (accessors.super__Vector_base<access,_std::allocator<access>_>._M_impl.
                super__Vector_impl_data._M_start)->col;
      lVar16 = 8;
      iVar17 = 0;
      for (uVar12 = 0; n != uVar12; uVar12 = uVar12 + 1) {
        if (uVar14 != *(uint *)((long)accessors.super__Vector_base<access,_std::allocator<access>_>.
                                      _M_impl.super__Vector_impl_data._M_start + lVar16 + -4)) {
          *(int *)(CONCAT44(cinit.m_buffer._M_t.
                            super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                            super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                            super__Head_base<0UL,_int_*,_false>._M_head_impl._4_4_,
                            cinit.m_buffer._M_t.
                            super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                            super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                            super__Head_base<0UL,_int_*,_false>._M_head_impl._0_4_) +
                  (ulong)uVar14 * 4) = iVar17;
          iVar17 = 0;
          uVar14 = *(uint *)((long)accessors.super__Vector_base<access,_std::allocator<access>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar16 + -4);
        }
        lVar10 = lVar16 + -8;
        puVar2 = (uint *)((long)&(accessors.super__Vector_base<access,_std::allocator<access>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->row + lVar16);
        iVar17 = iVar17 + 1;
        lVar16 = lVar16 + 0x14;
        cVar19.row = *(int *)((long)accessors.super__Vector_base<access,_std::allocator<access>_>.
                                    _M_impl.super__Vector_impl_data._M_start + lVar10);
        cVar19.value = (this->m_rows_values).m_buffer._M_t.
                       super___uniq_ptr_impl<baryonyx::sparse_matrix<int>::row_value,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                       .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>.
                       _M_head_impl[*puVar2].value;
        (this->m_cols_values).m_buffer._M_t.
        super___uniq_ptr_impl<baryonyx::sparse_matrix<int>::col_value,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
        ._M_t.
        super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
        .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>._M_head_impl
        [uVar12] = cVar19;
      }
      iVar15 = 0;
      *(int *)(CONCAT44(cinit.m_buffer._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>.
                        _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                        super__Head_base<0UL,_int_*,_false>._M_head_impl._4_4_,
                        cinit.m_buffer._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>.
                        _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                        super__Head_base<0UL,_int_*,_false>._M_head_impl._0_4_) + (ulong)uVar14 * 4)
           = iVar17;
      _Var8.super__Head_base<0UL,_int_*,_false>._M_head_impl =
           (this->m_rows_access).m_buffer._M_t.
           super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
           super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
           super__Head_base<0UL,_int_*,_false>;
      *(undefined4 *)_Var8.super__Head_base<0UL,_int_*,_false>._M_head_impl = 0;
      for (uVar12 = 0; uVar18 != uVar12; uVar12 = uVar12 + 1) {
        iVar15 = iVar15 + *(int *)(CONCAT44(rinit.m_buffer._M_t.
                                            super___uniq_ptr_impl<int,_std::default_delete<int[]>_>.
                                            _M_t.
                                            super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>
                                            .super__Head_base<0UL,_int_*,_false>._M_head_impl._4_4_,
                                            (int)rinit.m_buffer._M_t.
                                                 super___uniq_ptr_impl<int,_std::default_delete<int[]>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>
                                                 .super__Head_base<0UL,_int_*,_false>._M_head_impl)
                                  + uVar12 * 4);
        *(int *)((long)_Var8.super__Head_base<0UL,_int_*,_false>._M_head_impl + (uVar12 + 1) * 4) =
             iVar15;
      }
      iVar17 = 0;
      _Var9._M_head_impl =
           (this->m_cols_access).m_buffer._M_t.
           super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
           super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
           super__Head_base<0UL,_int_*,_false>._M_head_impl;
      *_Var9._M_head_impl = 0;
      for (uVar18 = 0; (uint)cols != uVar18; uVar18 = uVar18 + 1) {
        iVar17 = iVar17 + *(int *)(CONCAT44(cinit.m_buffer._M_t.
                                            super___uniq_ptr_impl<int,_std::default_delete<int[]>_>.
                                            _M_t.
                                            super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>
                                            .super__Head_base<0UL,_int_*,_false>._M_head_impl._4_4_,
                                            cinit.m_buffer._M_t.
                                            super___uniq_ptr_impl<int,_std::default_delete<int[]>_>.
                                            _M_t.
                                            super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>
                                            .super__Head_base<0UL,_int_*,_false>._M_head_impl._0_4_)
                                  + uVar18 * 4);
        _Var9._M_head_impl[uVar18 + 1] = iVar17;
      }
      std::unique_ptr<int[],_std::default_delete<int[]>_>::~unique_ptr(&cinit.m_buffer);
      std::unique_ptr<int[],_std::default_delete<int[]>_>::~unique_ptr(&rinit.m_buffer);
      std::_Vector_base<access,_std::allocator<access>_>::~_Vector_base
                (&accessors.super__Vector_base<access,_std::allocator<access>_>);
      return;
    }
    pfVar7 = *ppfVar13;
    p_Var1 = (_Vector_impl_data *)(ppfVar13 + -1);
    ppfVar13 = ppfVar13 + 5;
    lVar16 = uVar12 * 4;
    uVar12 = uVar12 + 1;
  } while (*(int *)(CONCAT44(rinit.m_buffer._M_t.
                             super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                             super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                             super__Head_base<0UL,_int_*,_false>._M_head_impl._4_4_,
                             (int)rinit.m_buffer._M_t.
                                  super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                                  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                                  super__Head_base<0UL,_int_*,_false>._M_head_impl) + lVar16) ==
           (int)((ulong)((long)pfVar7 - (long)p_Var1->_M_start) >> 3));
  details::fail_fast("Assertion","rinit[i] == static_cast<int>(csts[i].elements.size())",
                     "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/sparse-matrix.hpp"
                     ,"151");
}

Assistant:

explicit sparse_matrix(const std::vector<Constraint>& csts,
                           const int rows,
                           const int cols)
      : m_rows_access(rows + 1)
      , m_cols_access(cols + 1)
    {
        int elem = 0;

        for (int i = 0, e = rows; i != e; ++i)
            elem += static_cast<int>(csts[i].elements.size());

        row_vector_access(elem).swap(m_rows_values);
        col_vector_access(elem).swap(m_cols_values);

        //
        // First, we build a vector of access to all elements in the matrix
        // different to 0. Then, we sort accessors according to the column id
        // then we assign a unique identifier for each accessors and then we
        // sort accessors according to the row id. This code enable the
        // construction of the r_rows_values with pointers to the
        // r_cols_values.
        //

        struct access
        {
            access() = default;

            access(int row_, int col_, function_element fct_)
              : row(row_)
              , col(col_)
              , fct(fct_)
            {}

            int row;
            int col;
            int id;
            function_element fct;
        };

        std::vector<access> accessors;
        accessors.reserve(elem);
        for (int i = 0; i != rows; ++i)
            for (const auto& fct_elem : csts[i].elements)
                accessors.emplace_back(i, fct_elem.variable_index, fct_elem);

        fixed_array<int> rinit(rows, 0);
        int row = accessors[0].row;
        int nb_row = 0;
        for (int i = 0; i != elem; ++i) {
            if (row != accessors[i].row) {
                rinit[row] = nb_row;
                nb_row = 0;
                row = accessors[i].row;
            }
            ++nb_row;

            accessors[i].id = i;
            m_rows_values[i] = { i, accessors[i].col };
        }

        rinit[row] = nb_row; /* Be sure to affect the good number of elements
                                for this constaints. */

        for (int i = 0; i != rows; ++i)
            bx_assert(rinit[i] == static_cast<int>(csts[i].elements.size()));

        // We sort the accessors to improve memory friendly access.

        std::stable_sort(
          accessors.begin(),
          accessors.end(),
          [](const auto& lhs, const auto& rhs) { return lhs.col < rhs.col; });

        fixed_array<int> cinit(cols, 0);
        int col = accessors[0].col;
        int nb_col = 0;

        for (int i = 0; i != elem; ++i) {
            if (col != accessors[i].col) {
                cinit[col] = nb_col;
                nb_col = 0;
                col = accessors[i].col;
            }
            ++nb_col;

            m_cols_values[i] = { m_rows_values[accessors[i].id].value,
                                 accessors[i].row };
        }

        cinit[col] = nb_col; /* Be sure to affect the good number of elements
                                for this constaints. */

        m_rows_access[0] = 0;
        for (int i = 0; i != rows; ++i)
            m_rows_access[i + 1] = m_rows_access[i] + rinit[i];

        m_cols_access[0] = 0;
        for (int i = 0; i != cols; ++i)
            m_cols_access[i + 1] = m_cols_access[i] + cinit[i];
    }